

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O2

pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> * __thiscall
Disa::Matrix_Sparse::insert
          (pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool>
           *__return_storage_ptr__,Matrix_Sparse *this,size_t *i_row,size_t *i_column,double *value)

{
  pointer puVar1;
  pointer pdVar2;
  bool bVar3;
  iterator i_column_00;
  iterator value_00;
  long lVar4;
  pointer puVar5;
  iterator_element iter_insert;
  iterator_element local_88;
  double *local_68;
  iterator local_60;
  
  lVar4 = (long)(this->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_68 = value;
  if ((lVar4 == 0) || ((lVar4 >> 3) - 1U <= *i_row)) {
    local_88.column_index = (size_type *)(*i_row + 1);
    resize(this,(size_t *)&local_88,&this->column_size);
  }
  if (this->column_size <= *i_column) {
    puVar5 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar1 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_88.column_index = (size_t *)0x0;
    if (puVar5 != puVar1) {
      local_88.column_index = (size_t *)(((long)puVar5 - (long)puVar1 >> 3) + -1);
    }
    local_60.column_index = (size_type *)(*i_column + 1);
    resize(this,(size_t *)&local_88,(size_t *)&local_60);
  }
  lower_bound(&local_88,this,i_row,i_column);
  operator[]((Matrix_Sparse *)&stack0xffffffffffffffc0,(size_t *)this);
  Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            (&local_60,(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&stack0xffffffffffffffc0);
  if (((((local_88.matrix == local_60.matrix) && (local_88.row_index == local_60.row_index)) &&
       (local_88.column_index == local_60.column_index)) && (local_88.value == local_60.value)) ||
     (*local_88.column_index != *i_column)) {
    puVar1 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar5 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start + local_88.row_index;
    while (puVar5 = puVar5 + 1, puVar5 < puVar1) {
      *puVar5 = *puVar5 + 1;
    }
    pdVar2 = (this->element_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    i_column_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
                            (&this->column_index,
                             (unsigned_long *)
                             ((long)local_88.value +
                             ((long)(this->column_index).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)pdVar2)),
                             i_column);
    value_00 = std::vector<double,_std::allocator<double>_>::insert
                         (&this->element_value,
                          (double *)
                          ((long)local_88.value +
                          ((long)(this->element_value).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start - (long)pdVar2)),local_68);
    Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
              (&__return_storage_ptr__->first,this,i_row,i_column_00._M_current,value_00._M_current)
    ;
    bVar3 = true;
  }
  else {
    (__return_storage_ptr__->first).row_index = local_88.row_index;
    (__return_storage_ptr__->first).matrix = local_88.matrix;
    (__return_storage_ptr__->first).column_index = local_88.column_index;
    (__return_storage_ptr__->first).value = local_88.value;
    bVar3 = false;
  }
  __return_storage_ptr__->second = bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Matrix_Sparse::iterator_element, bool> Matrix_Sparse::insert(const std::size_t& i_row,
                                                                       const std::size_t& i_column,
                                                                       const double& value) {
  // Resize if we need to.
  if(i_row >= size_row()) resize(i_row + 1, column_size);
  if(i_column >= size_column()) resize(size_row(), i_column + 1);
  const auto iter_insert = lower_bound(i_row, i_column);
  if(!(iter_insert == (*this)[i_row].end() || iter_insert.i_column() != i_column)) return {iter_insert, false};

  for(auto non_zeros = std::next(row_non_zero.begin(), static_cast<s_size_t>(iter_insert.i_row() + 1));
      non_zeros < row_non_zero.end(); ++(*non_zeros++))
    ;
  const auto distance = std::distance(&*element_value.cbegin(), &*iter_insert);
  return {{this, i_row, &*column_index.insert(column_index.begin() + distance, i_column),
           &*element_value.insert(element_value.begin() + distance, value)},
          true};
}